

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_reloc_text(BuildCtx *ctx,uint8_t *cp,int n,char *sym)

{
  int iVar1;
  char *local_30;
  char *opname;
  char *sym_local;
  int n_local;
  uint8_t *cp_local;
  BuildCtx *ctx_local;
  
  sym_local._4_4_ = n + -1;
  if (-1 < sym_local._4_4_) {
    if (cp[sym_local._4_4_] == 0xe8) {
      local_30 = "call";
    }
    else if (cp[sym_local._4_4_] == 0xe9) {
      local_30 = "jmp";
    }
    else {
      if ((((cp[sym_local._4_4_] < 0x80) || (0x8f < cp[sym_local._4_4_])) || (sym_local._4_4_ < 1))
         || (cp[n + -2] != '\x0f')) goto LAB_0010baca;
      local_30 = jccnames[(int)(cp[sym_local._4_4_] - 0x80)];
      sym_local._4_4_ = n + -2;
    }
    emit_asm_bytes(ctx,cp,sym_local._4_4_);
    iVar1 = strncmp(sym + (int)(uint)(*sym == '_'),"lj_",3);
    if ((iVar1 == 0) || (ctx->mode != BUILD_elfasm)) {
      fprintf((FILE *)ctx->fp,"\t%s %s\n",local_30,sym);
    }
    else {
      fprintf((FILE *)ctx->fp,"\t%s %s@PLT\n",local_30,sym);
    }
    return;
  }
LAB_0010baca:
  fprintf(_stderr,"Error: unsupported opcode for %s symbol relocation.\n",sym);
  exit(1);
}

Assistant:

static void emit_asm_reloc_text(BuildCtx *ctx, uint8_t *cp, int n,
				const char *sym)
{
  const char *opname = NULL;
  if (--n < 0) goto err;
  if (cp[n] == 0xe8) {
    opname = "call";
  } else if (cp[n] == 0xe9) {
    opname = "jmp";
  } else if (cp[n] >= 0x80 && cp[n] <= 0x8f && n > 0 && cp[n-1] == 0x0f) {
    opname = jccnames[cp[n]-0x80];
    n--;
  } else {
err:
    fprintf(stderr, "Error: unsupported opcode for %s symbol relocation.\n",
	    sym);
    exit(1);
  }
  emit_asm_bytes(ctx, cp, n);
  if (strncmp(sym+(*sym == '_'), LABEL_PREFIX, sizeof(LABEL_PREFIX)-1)) {
    /* Various fixups for external symbols outside of our binary. */
    if (ctx->mode == BUILD_elfasm) {
      if (LJ_32)
	fprintf(ctx->fp, "#if __PIC__\n\t%s lj_wrap_%s\n#else\n", opname, sym);
      fprintf(ctx->fp, "\t%s %s@PLT\n", opname, sym);
      if (LJ_32)
	fprintf(ctx->fp, "#endif\n");
      return;
    } else if (LJ_32 && ctx->mode == BUILD_machasm) {
      fprintf(ctx->fp, "\t%s L%s$stub\n", opname, sym);
      return;
    }
  }
  fprintf(ctx->fp, "\t%s %s\n", opname, sym);
}